

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool doctest::anon_unknown_14::fileOrderComparator(TestCase *lhs,TestCase *rhs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  TestCase *__s2;
  TestCase *__s1;
  bool bVar4;
  
  __s2 = rhs;
  if ((rhs->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') {
    __s2 = (TestCase *)(rhs->super_TestCaseData).m_file.field_0.data.ptr;
  }
  __s1 = lhs;
  if ((lhs->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') {
    __s1 = (TestCase *)(lhs->super_TestCaseData).m_file.field_0.data.ptr;
  }
  iVar3 = strcmp((char *)__s1,(char *)__s2);
  if (iVar3 == 0) {
    uVar1 = (rhs->super_TestCaseData).m_line;
    uVar2 = (lhs->super_TestCaseData).m_line;
    bVar4 = uVar2 < uVar1;
    if (uVar2 == uVar1) {
      bVar4 = lhs->m_template_id < rhs->m_template_id;
    }
  }
  else {
    bVar4 = SUB41((uint)iVar3 >> 0x1f,0);
  }
  return bVar4;
}

Assistant:

bool fileOrderComparator(const TestCase* lhs, const TestCase* rhs) {
        // this is needed because MSVC gives different case for drive letters
        // for __FILE__ when evaluated in a header and a source file
        const int res = lhs->m_file.compare(rhs->m_file, bool(DOCTEST_MSVC));
        if(res != 0)
            return res < 0;
        if(lhs->m_line != rhs->m_line)
            return lhs->m_line < rhs->m_line;
        return lhs->m_template_id < rhs->m_template_id;
    }